

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2d.hpp
# Opt level: O1

void remora::bindings::
     conv2d<remora::matrix<float,remora::row_major,remora::cpu_tag>,remora::vector<float,remora::cpu_tag>,remora::matrix<float,remora::row_major,remora::cpu_tag>>
               (matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *images,vector_expression<remora::vector<float,_remora::cpu_tag>,_remora::cpu_tag>
                        *filter,
               matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
               *outputs,size_t num_channels,size_t num_filters,size_t image_height,
               size_t image_width,size_t filter_height,size_t filter_width,size_t padding_height,
               size_t padding_width)

{
  long lVar1;
  pointer __ptr;
  pointer __ptr_00;
  long lVar2;
  pointer pfVar3;
  size_t sVar4;
  size_type sVar5;
  long lVar6;
  long lVar7;
  size_type sVar8;
  aligned_allocator<float,_64UL> allocator;
  dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag> image_transformed
  ;
  dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>
  output_transformed;
  pointer local_50;
  size_type local_48;
  size_t local_40;
  size_type local_38;
  
  sVar8 = filter_height * num_channels * filter_width;
  sVar5 = ((image_width - filter_width) + padding_width + 1) *
          ((image_height - filter_height) + padding_height + 1) * *(long *)images;
  __ptr = boost::alignment::aligned_allocator<float,_64UL>::allocate
                    (&allocator,sVar5 * sVar8,(const_void_pointer)0x0);
  __ptr_00 = boost::alignment::aligned_allocator<float,_64UL>::allocate
                       (&allocator,sVar8 * num_filters,(const_void_pointer)0x0);
  output_transformed.m_values = *(float **)(outputs + 0x10);
  image_transformed.m_values = __ptr;
  image_transformed.m_size1 = sVar5;
  image_transformed.m_size2 = sVar8;
  image_transformed.m_leading_dimension = sVar8;
  output_transformed.m_size1 = sVar5;
  output_transformed.m_size2 = num_filters;
  output_transformed.m_leading_dimension = num_filters;
  if (padding_width == 0 && padding_height == 0) {
    im2mat<remora::matrix<float,remora::row_major,remora::cpu_tag>,remora::dense_matrix_adaptor<float,remora::row_major,remora::cpu_tag,remora::cpu_tag>>
              (images,(matrix_expression<remora::dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
                       *)&image_transformed,num_channels,image_height,image_width,filter_height,
               filter_width);
  }
  else {
    im2mat_pad<remora::matrix<float,remora::row_major,remora::cpu_tag>,remora::dense_matrix_adaptor<float,remora::row_major,remora::cpu_tag,remora::cpu_tag>>
              (images,(matrix_expression<remora::dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
                       *)&image_transformed,num_channels,image_height,image_width,filter_height,
               filter_width,padding_height,padding_width);
  }
  if (num_filters != 0) {
    lVar7 = filter_width * filter_height * num_channels;
    lVar2 = 0;
    sVar4 = 0;
    pfVar3 = __ptr_00;
    do {
      if (sVar8 != 0) {
        lVar1 = *(long *)filter;
        lVar6 = 0;
        do {
          pfVar3[lVar6] = *(float *)(lVar1 + lVar2 + lVar6 * 4);
          lVar6 = lVar6 + 1;
        } while (sVar8 - lVar6 != 0);
      }
      sVar4 = sVar4 + 1;
      pfVar3 = pfVar3 + lVar7;
      lVar2 = lVar2 + lVar7 * 4;
    } while (sVar4 != num_filters);
  }
  local_50 = __ptr_00;
  local_48 = sVar8;
  local_40 = num_filters;
  local_38 = sVar8;
  dense_gemm<remora::dense_matrix_adaptor<float,remora::row_major,remora::cpu_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<float,remora::column_major,remora::cpu_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<float,remora::row_major,remora::cpu_tag,remora::cpu_tag>>
            ((matrix_expression<remora::dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
              *)&image_transformed,
             (matrix_expression<remora::dense_matrix_adaptor<float,_remora::column_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
              *)&local_50,
             (matrix_expression<remora::dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
              *)&output_transformed,1.0);
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void conv2d(
	matrix_expression<E1, cpu_tag> const& images,
	vector_expression<E2, cpu_tag> const& filter,
	matrix_expression<M, cpu_tag>& outputs,
	std::size_t num_channels,
	std::size_t num_filters,
	std::size_t image_height,
	std::size_t image_width,
	std::size_t filter_height,
	std::size_t filter_width,
	std::size_t padding_height,
	std::size_t padding_width
){
	static_assert(std::is_same<typename E1::orientation, row_major>::value, "Column major not implemented");
	static_assert(std::is_same<typename E1::storage_type::storage_tag, continuous_dense_tag>::value, "Subranges not implemented");
	static_assert(std::is_same<typename M::orientation, row_major>::value, "Column major not implemented");
	typedef typename std::common_type<
		typename E1::value_type, typename E2::value_type, typename M::value_type
	>::type value_type;
	
	std::size_t output_rows_per_filter = (image_height  - filter_height +1 + padding_height) * (image_width - filter_width +1 + padding_width);
	std::size_t filter_size = filter_width * filter_height * num_channels;
	std::size_t num_images = images().size1();
	
	REMORA_SIZE_CHECK(outputs().size1() == images().size1());
	REMORA_SIZE_CHECK(outputs().size2() == num_filters * output_rows_per_filter);
	REMORA_SIZE_CHECK(images().size2() == num_channels * image_width * image_height);
	REMORA_SIZE_CHECK(filter().size() == num_filters * filter_size);
	
	//allocate storage and create temporary matrices
	boost::alignment::aligned_allocator<value_type,64> allocator;
	value_type* image_storage = allocator.allocate( num_images * output_rows_per_filter * filter_size);
	value_type* filter_storage = allocator.allocate(num_filters * filter_size);
	dense_matrix_adaptor<value_type, row_major, cpu_tag> image_transformed(image_storage,num_images * output_rows_per_filter, filter_size);
	dense_matrix_adaptor<value_type, row_major, cpu_tag> filter_transformed(filter_storage, num_filters, filter_size);
	dense_matrix_adaptor<value_type, row_major, cpu_tag> output_transformed(outputs().raw_storage().values, num_images * output_rows_per_filter, num_filters);
	//copy image to temporary storage
	if(padding_height == 0 && padding_width == 0){
		im2mat(images,image_transformed, num_channels, image_height, image_width, filter_height, filter_width);
	}else{
		im2mat_pad(images,image_transformed, num_channels, image_height, image_width, filter_height, filter_width, padding_height, padding_width);
	}
	//copy filters to temporary storage
	for(std::size_t f = 0; f != num_filters; ++f){
		for(std::size_t i = 0; i != filter_size; ++i){
			filter_transformed(f,i) = filter()(f * filter_size + i);
		}
	}
	
	//do the computation
	kernels::gemm(image_transformed, trans(filter_transformed), output_transformed, value_type(1.0));
	
	//deallocate storage
	allocator.deallocate(image_storage,num_images * output_rows_per_filter * filter_size);
	allocator.deallocate(filter_storage, num_filters * filter_size);
}